

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

char * Curl_checkProxyheaders(Curl_easy *data,connectdata *conn,char *thisheader,size_t thislen)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  
  if ((((ulong)conn->bits & 0x10) == 0) || (lVar2 = 0x6d8, ((data->set).field_0x8ca & 8) == 0)) {
    lVar2 = 0x358;
  }
  plVar3 = (long *)((long)&data->magic + lVar2);
  while( true ) {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) {
      return (char *)0x0;
    }
    iVar1 = curl_strnequal((char *)*plVar3,thisheader,thislen);
    if ((iVar1 != 0) && ((((char *)*plVar3)[thislen] & 0xfeU) == 0x3a)) break;
    plVar3 = plVar3 + 1;
  }
  return (char *)*plVar3;
}

Assistant:

char *Curl_checkProxyheaders(struct Curl_easy *data,
                             const struct connectdata *conn,
                             const char *thisheader,
                             const size_t thislen)
{
  struct curl_slist *head;

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]))
      return head->data;
  }

  return NULL;
}